

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswTable.c
# Opt level: O3

Aig_Obj_t * Csw_TableCutLookup(Csw_Man_t *p,Csw_Cut_t *pCut)

{
  char cVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  Csw_Cut_t *pCVar14;
  ulong uVar15;
  
  uVar9 = Csw_CutHash(pCut);
  pCVar14 = p->pTable[(int)(uVar9 % (uint)p->nTableSize)];
  if (pCVar14 != (Csw_Cut_t *)0x0) {
    cVar1 = pCut->nFanins;
    uVar15 = 1;
    if (5 < (long)cVar1) {
      uVar15 = (ulong)(uint)(1 << (cVar1 - 5U & 0x1f));
    }
    do {
      if (((pCVar14->nFanins == cVar1) && (pCVar14->uSign == pCut->uSign)) &&
         (iVar10 = bcmp(pCVar14 + 1,pCut + 1,(long)cVar1 * 4), iVar10 == 0)) {
        lVar11 = (long)pCVar14->nLeafMax;
        lVar12 = (long)pCut->nLeafMax;
        uVar13 = uVar15;
        if (((*(uint *)((long)&pCut[1].pNext + lVar12 * 4) ^
             *(uint *)((long)&pCVar14[1].pNext + lVar11 * 4)) & 1) == 0) {
          do {
            if ((int)uVar13 < 1) {
              iVar10 = pCVar14->iNode;
              if (-1 < (long)iVar10) {
                pVVar3 = p->pManRes->vObjs;
                uVar9 = pVVar3->nSize;
                if (iVar10 < (int)uVar9) {
                  uVar2 = pCut->iNode;
                  if ((-1 < (long)(int)uVar2) && (uVar2 < uVar9)) {
                    ppvVar4 = pVVar3->pArray;
                    pAVar5 = (Aig_Obj_t *)ppvVar4[iVar10];
                    if (((*(uint *)((long)ppvVar4[(int)uVar2] + 0x18) ^ *(uint *)&pAVar5->field_0x18
                         ) & 8) != 0) {
                      __assert_fail("pRes->fPhase == Aig_ManObj( p->pManRes, pCut->iNode )->fPhase",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswTable.c"
                                    ,0x8e,"Aig_Obj_t *Csw_TableCutLookup(Csw_Man_t *, Csw_Cut_t *)")
                      ;
                    }
                    return pAVar5;
                  }
                }
              }
LAB_004a9fbe:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            lVar7 = uVar13 * 2;
            lVar8 = uVar13 * 2;
            uVar13 = uVar13 - 1;
          } while (*(int *)(&pCVar14->nCutSize + lVar11 * 2 + lVar7) ==
                   *(int *)(&pCut->nCutSize + lVar12 * 2 + lVar8));
        }
        else {
          do {
            if ((int)uVar13 < 1) {
              iVar10 = pCVar14->iNode;
              if (-1 < (long)iVar10) {
                pVVar3 = p->pManRes->vObjs;
                uVar9 = pVVar3->nSize;
                if (iVar10 < (int)uVar9) {
                  uVar2 = pCut->iNode;
                  if ((-1 < (long)(int)uVar2) && (uVar2 < uVar9)) {
                    ppvVar4 = pVVar3->pArray;
                    pvVar6 = ppvVar4[iVar10];
                    if (((*(uint *)((long)ppvVar4[(int)uVar2] + 0x18) ^
                         *(uint *)(((ulong)pvVar6 & 0xfffffffffffffffe) + 0x18)) & 8) == 0) {
                      __assert_fail("Aig_Regular(pRes)->fPhase != Aig_ManObj( p->pManRes, pCut->iNode )->fPhase"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswTable.c"
                                    ,0x97,"Aig_Obj_t *Csw_TableCutLookup(Csw_Man_t *, Csw_Cut_t *)")
                      ;
                    }
                    return (Aig_Obj_t *)((ulong)pvVar6 ^ 1);
                  }
                }
              }
              goto LAB_004a9fbe;
            }
            lVar7 = uVar13 * 2;
            lVar8 = uVar13 * 2;
            uVar13 = uVar13 - 1;
          } while ((*(uint *)(&pCut->nCutSize + lVar12 * 2 + lVar7) ^
                   *(uint *)(&pCVar14->nCutSize + lVar11 * 2 + lVar8)) == 0xffffffff);
        }
      }
      pCVar14 = pCVar14->pNext;
    } while (pCVar14 != (Csw_Cut_t *)0x0);
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

Aig_Obj_t * Csw_TableCutLookup( Csw_Man_t * p, Csw_Cut_t * pCut )
{
    Aig_Obj_t * pRes = NULL;
    Csw_Cut_t * pEnt;
    unsigned * pTruthNew, * pTruthOld;
    int iEntry = Csw_CutHash(pCut) % p->nTableSize;
    for ( pEnt = p->pTable[iEntry]; pEnt; pEnt = pEnt->pNext )
    {
        if ( pEnt->nFanins != pCut->nFanins )
            continue;
        if ( pEnt->uSign != pCut->uSign )
            continue;
        if ( memcmp( pEnt->pFanins, pCut->pFanins, sizeof(int) * pCut->nFanins ) )
            continue;
        pTruthOld = Csw_CutTruth(pEnt);
        pTruthNew = Csw_CutTruth(pCut);
        if ( (pTruthOld[0] & 1) == (pTruthNew[0] & 1) )
        {
            if ( Kit_TruthIsEqual( pTruthOld, pTruthNew, pCut->nFanins ) )
            {
                pRes = Aig_ManObj( p->pManRes, pEnt->iNode );
                assert( pRes->fPhase == Aig_ManObj( p->pManRes, pCut->iNode )->fPhase );
                break;
            }
        }
        else
        {
            if ( Kit_TruthIsOpposite( pTruthOld, pTruthNew, pCut->nFanins ) )
            {
                pRes = Aig_Not( Aig_ManObj( p->pManRes, pEnt->iNode ) );
                assert( Aig_Regular(pRes)->fPhase != Aig_ManObj( p->pManRes, pCut->iNode )->fPhase );
                break;
            }
        }
    }
    return pRes;
}